

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLcode setname(curl_mimepart *part,char *name,size_t len)

{
  CURLcode CVar1;
  char *name_00;
  
  if (name != (char *)0x0 && len != 0) {
    name_00 = (char *)Curl_memdup0(name,len);
    if (name_00 == (char *)0x0) {
      CVar1 = CURLE_OUT_OF_MEMORY;
    }
    else {
      CVar1 = curl_mime_name(part,name_00);
      (*Curl_cfree)(name_00);
    }
    return CVar1;
  }
  CVar1 = curl_mime_name(part,name);
  return CVar1;
}

Assistant:

static CURLcode setname(curl_mimepart *part, const char *name, size_t len)
{
  char *zname;
  CURLcode res;

  if(!name || !len)
    return curl_mime_name(part, name);
  zname = Curl_memdup0(name, len);
  if(!zname)
    return CURLE_OUT_OF_MEMORY;
  res = curl_mime_name(part, zname);
  free(zname);
  return res;
}